

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateEmptyString_abi_cxx11_(Tables *this)

{
  string *result;
  
  result = (string *)operator_new(0x20);
  (result->_M_dataplus)._M_p = (pointer)&result->field_2;
  result->_M_string_length = 0;
  (result->field_2)._M_local_buf[0] = '\0';
  std::
  vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
  ::emplace_back<std::__cxx11::string*&>
            ((vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
              *)&this->strings_,&result);
  return result;
}

Assistant:

std::string* DescriptorPool::Tables::AllocateEmptyString() {
  std::string* result = new std::string();
  strings_.emplace_back(result);
  return result;
}